

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O0

size_t __thiscall wallet::CoinsResult::Size(CoinsResult *this)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  long in_FS_OFFSET;
  pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_> *it;
  map<OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  *__range1;
  size_t size;
  const_iterator __end1;
  const_iterator __begin1;
  vector<wallet::COutput,_std::allocator<wallet::COutput>_> *in_stack_ffffffffffffffb8;
  map<OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  *in_stack_ffffffffffffffc0;
  reference in_stack_ffffffffffffffc8;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = 0;
  std::
  map<OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::begin(in_stack_ffffffffffffffc0);
  std::
  map<OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::end(in_stack_ffffffffffffffc0);
  while( true ) {
    bVar2 = std::operator==((_Self *)in_stack_ffffffffffffffc8,(_Self *)in_stack_ffffffffffffffc0);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffc8 =
         std::
         _Rb_tree_const_iterator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>
         ::operator*((_Rb_tree_const_iterator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>
                      *)in_stack_ffffffffffffffb8);
    sVar3 = std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::size
                      (in_stack_ffffffffffffffb8);
    local_28 = sVar3 + local_28;
    std::
    _Rb_tree_const_iterator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>
                  *)in_stack_ffffffffffffffb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_28;
  }
  __stack_chk_fail();
}

Assistant:

size_t CoinsResult::Size() const
{
    size_t size{0};
    for (const auto& it : coins) {
        size += it.second.size();
    }
    return size;
}